

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1bacb1::fillPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  ulong uVar1;
  half *phVar2;
  uint i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int x;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase(ph,(long)height,(long)width);
  uVar7 = 0;
  uVar1 = 0;
  if (0 < width) {
    uVar1 = (ulong)(uint)width;
  }
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar7;
  }
  for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      lVar5 = sampleCount->_sizeY;
      phVar2 = (half *)operator_new__((ulong)sampleCount->_data[lVar5 * uVar7 + uVar6] * 2);
      ph->_data[ph->_sizeY * uVar7 + uVar6] = phVar2;
      lVar8 = 0;
      for (uVar4 = 0; uVar4 < sampleCount->_data[lVar5 * uVar7 + uVar6]; uVar4 = uVar4 + 1) {
        Imath_3_2::half::operator=
                  ((half *)((long)&ph->_data[ph->_sizeY * uVar7 + uVar6]->_h + lVar8),
                   (float)(((int)uVar7 * width + (int)uVar6) % 0x801));
        lVar5 = sampleCount->_sizeY;
        lVar8 = lVar8 + 2;
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}